

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# speculative.cpp
# Opt level: O0

llama_tokens *
common_speculative_gen_draft
          (common_speculative *spec,common_speculative_params params,llama_tokens *prompt_tgt,
          llama_token id_last)

{
  float *pfVar1;
  llama_pos *plVar2;
  int32_t *piVar3;
  llama_seq_id **pplVar4;
  llama_token *plVar5;
  const_iterator __last;
  const_iterator __last_00;
  initializer_list<int> __l;
  initializer_list<int> __l_00;
  initializer_list<int> __l_01;
  uint uVar6;
  uint uVar7;
  int iVar8;
  size_type sVar9;
  int *piVar10;
  const_reference pvVar11;
  reference pvVar12;
  common_log *pcVar13;
  undefined8 uVar14;
  vector<int,_std::allocator<int>_> *in_RCX;
  undefined8 in_RDX;
  undefined8 *in_RSI;
  vector<int,_std::allocator<int>_> *in_RDI;
  int in_R8D;
  bool bVar15;
  float in_XMM0_Da;
  llama_token id;
  int k;
  llama_token_data_array *cur_p;
  int i_3;
  llama_pos n_past;
  size_t i_2;
  int i_1;
  int cur;
  int i;
  int i_start;
  int n_ctx;
  int reuse_n;
  int reuse_i;
  llama_tokens *prompt;
  common_sampler **smpl;
  llama_context **ctx;
  llama_batch *batch;
  llama_tokens *result;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffc28;
  undefined4 uVar16;
  undefined4 in_stack_fffffffffffffc30;
  undefined4 in_stack_fffffffffffffc34;
  undefined4 in_stack_fffffffffffffc38;
  undefined4 in_stack_fffffffffffffc3c;
  undefined4 in_stack_fffffffffffffc40;
  undefined4 in_stack_fffffffffffffc44;
  llama_pos in_stack_fffffffffffffc48;
  llama_token in_stack_fffffffffffffc4c;
  undefined4 in_stack_fffffffffffffc50;
  undefined4 in_stack_fffffffffffffc54;
  const_iterator in_stack_fffffffffffffc58;
  allocator_type *__a;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffc60;
  llama_batch *this;
  undefined4 in_stack_fffffffffffffc68;
  llama_token lVar17;
  undefined4 in_stack_fffffffffffffc6c;
  size_type in_stack_fffffffffffffc70;
  undefined1 *puVar18;
  int in_stack_fffffffffffffc78;
  undefined1 uVar19;
  uint in_stack_fffffffffffffc7c;
  uint in_stack_fffffffffffffc80;
  uint in_stack_fffffffffffffc84;
  common_sampler *in_stack_fffffffffffffc88;
  ulong uVar20;
  undefined4 uStack_290;
  undefined4 uStack_28c;
  undefined4 local_288;
  undefined4 uStack_284;
  undefined4 uStack_280;
  llama_token lStack_27c;
  llama_pos local_278;
  llama_token lStack_274;
  undefined4 uStack_270;
  undefined4 uStack_26c;
  undefined1 local_25d;
  undefined4 local_25c;
  undefined4 *local_258;
  undefined8 local_250;
  llama_token local_22c;
  string local_228 [36];
  int local_204 [3];
  llama_token_data_array *local_1f8;
  uint local_1ec;
  undefined8 local_1e8;
  undefined8 uStack_1e0;
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  undefined8 local_1c8;
  undefined8 uStack_1c0;
  allocator_type *local_1b8;
  undefined4 local_1ac;
  undefined4 *local_1a8;
  undefined8 local_1a0;
  uint local_17c;
  undefined8 local_178;
  llama_token *plStack_170;
  undefined8 local_168;
  undefined8 uStack_160;
  undefined8 local_158;
  undefined8 uStack_150;
  allocator_type *local_148;
  undefined4 local_134;
  undefined4 *local_130;
  undefined8 local_128;
  ulong local_108;
  int *local_100;
  int *local_f8;
  int *local_e8;
  int *local_e0;
  int *local_d0;
  int *local_c8;
  int *local_c0;
  int *local_b0;
  int local_98;
  undefined1 local_81;
  uint local_80;
  uint local_7c;
  int local_78 [3];
  int local_6c;
  uint local_68;
  uint local_64;
  vector<int,_std::allocator<int>_> *local_60;
  undefined8 *local_58;
  undefined8 *local_50;
  llama_batch *local_48;
  int local_3c;
  vector<int,_std::allocator<int>_> *local_38;
  undefined8 local_14;
  float local_c;
  
  local_48 = (llama_batch *)(in_RSI + 2);
  local_58 = in_RSI + 1;
  local_60 = (vector<int,_std::allocator<int>_> *)(in_RSI + 9);
  local_64 = 0;
  local_68 = 0;
  local_50 = in_RSI;
  local_3c = in_R8D;
  local_38 = in_RCX;
  local_14 = in_RDX;
  local_c = in_XMM0_Da;
  local_6c = llama_n_ctx(*in_RSI);
  local_6c = local_6c - (int)local_14;
  local_78[1] = 0;
  sVar9 = std::vector<int,_std::allocator<int>_>::size(local_38);
  local_78[0] = (int)sVar9 - local_6c;
  piVar10 = std::max<int>(local_78 + 1,local_78);
  local_78[2] = *piVar10;
  for (local_7c = 0; uVar6 = local_7c,
      sVar9 = std::vector<int,_std::allocator<int>_>::size(local_60), (int)uVar6 < (int)sVar9;
      local_7c = local_7c + 1) {
    local_80 = 0;
    while( true ) {
      iVar8 = local_78[2] + local_80;
      sVar9 = std::vector<int,_std::allocator<int>_>::size(local_38);
      bVar15 = false;
      if (iVar8 < (int)sVar9) {
        iVar8 = local_7c + local_80;
        sVar9 = std::vector<int,_std::allocator<int>_>::size(local_60);
        bVar15 = false;
        if (iVar8 < (int)sVar9) {
          pvVar11 = std::vector<int,_std::allocator<int>_>::operator[]
                              (local_38,(long)(int)(local_78[2] + local_80));
          iVar8 = *pvVar11;
          pvVar12 = std::vector<int,_std::allocator<int>_>::operator[]
                              (local_60,(long)(int)(local_7c + local_80));
          bVar15 = iVar8 == *pvVar12;
        }
      }
      iVar8 = local_6c;
      if (!bVar15) break;
      local_80 = local_80 + 1;
    }
    if (((local_14._4_4_ <= (int)local_80) ||
        (sVar9 = std::vector<int,_std::allocator<int>_>::size(local_38), (int)sVar9 <= iVar8)) &&
       ((int)local_68 < (int)local_80)) {
      local_64 = local_7c;
      local_68 = local_80;
    }
  }
  if (0 < common_log_verbosity_thold) {
    pcVar13 = common_log_main();
    uVar7 = local_64;
    uVar6 = local_68;
    uVar16 = (undefined4)((ulong)in_stack_fffffffffffffc28 >> 0x20);
    sVar9 = std::vector<int,_std::allocator<int>_>::size(local_60);
    in_stack_fffffffffffffc28 = (vector<int,_std::allocator<int>_> *)CONCAT44(uVar16,(int)sVar9);
    common_log_add(pcVar13,GGML_LOG_LEVEL_DEBUG,"%s: reuse_i = %d, reuse_n = %d, prompt = %d\n",
                   "common_speculative_gen_draft",(ulong)uVar7,(ulong)uVar6);
  }
  local_81 = 0;
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x367933);
  std::vector<int,_std::allocator<int>_>::reserve
            (in_stack_fffffffffffffc60,(size_type)in_stack_fffffffffffffc58._M_current);
  if (local_68 == 0) {
    llama_kv_self_clear(*local_50);
    std::vector<int,_std::allocator<int>_>::clear((vector<int,_std::allocator<int>_> *)0x367973);
  }
  else {
    iVar8 = local_64 + local_68;
    sVar9 = std::vector<int,_std::allocator<int>_>::size(local_60);
    if ((iVar8 < (int)sVar9) &&
       (pvVar12 = std::vector<int,_std::allocator<int>_>::operator[]
                            (local_60,(long)(int)(local_64 + local_68)), *pvVar12 == local_3c)) {
      local_98 = local_64 + local_68;
      do {
        local_98 = local_98 + 1;
        iVar8 = local_98;
        sVar9 = std::vector<int,_std::allocator<int>_>::size(local_60);
        if ((int)sVar9 <= iVar8) {
          return in_RDI;
        }
        std::vector<int,_std::allocator<int>_>::operator[](local_60,(long)local_98);
        std::vector<int,_std::allocator<int>_>::push_back
                  ((vector<int,_std::allocator<int>_> *)
                   CONCAT44(in_stack_fffffffffffffc44,in_stack_fffffffffffffc40),
                   (value_type_conflict *)
                   CONCAT44(in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38));
        iVar8 = (int)local_14;
        sVar9 = std::vector<int,_std::allocator<int>_>::size(in_RDI);
      } while ((int)sVar9 < iVar8);
      return in_RDI;
    }
    if (0 < (int)local_64) {
      llama_kv_self_seq_rm(*local_50,0,0,local_64);
      llama_kv_self_seq_add(*local_50,0,local_64,0xffffffff,-local_64);
      local_b0 = (int *)std::vector<int,_std::allocator<int>_>::begin(in_stack_fffffffffffffc28);
      __gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>::
      __normal_iterator<int*>
                ((__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> *)
                 CONCAT44(in_stack_fffffffffffffc34,in_stack_fffffffffffffc30),
                 (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                 in_stack_fffffffffffffc28);
      local_c8 = (int *)std::vector<int,_std::allocator<int>_>::begin(in_stack_fffffffffffffc28);
      local_c0 = (int *)__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                        ::operator+((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                                     *)CONCAT44(in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38)
                                    ,CONCAT44(in_stack_fffffffffffffc34,in_stack_fffffffffffffc30));
      __gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>::
      __normal_iterator<int*>
                ((__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> *)
                 CONCAT44(in_stack_fffffffffffffc34,in_stack_fffffffffffffc30),
                 (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                 in_stack_fffffffffffffc28);
      __last._M_current._4_4_ = in_stack_fffffffffffffc54;
      __last._M_current._0_4_ = in_stack_fffffffffffffc50;
      local_d0 = (int *)std::vector<int,_std::allocator<int>_>::erase
                                  ((vector<int,_std::allocator<int>_> *)
                                   CONCAT44(in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48),
                                   in_stack_fffffffffffffc58,__last);
    }
    uVar6 = local_68;
    sVar9 = std::vector<int,_std::allocator<int>_>::size(local_60);
    if ((int)uVar6 < (int)sVar9) {
      llama_kv_self_seq_rm(*local_50,0,local_68,0xffffffff);
      local_e8 = (int *)std::vector<int,_std::allocator<int>_>::begin(in_stack_fffffffffffffc28);
      local_e0 = (int *)__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                        ::operator+((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                                     *)CONCAT44(in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38)
                                    ,CONCAT44(in_stack_fffffffffffffc34,in_stack_fffffffffffffc30));
      __gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>::
      __normal_iterator<int*>
                ((__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> *)
                 CONCAT44(in_stack_fffffffffffffc34,in_stack_fffffffffffffc30),
                 (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                 in_stack_fffffffffffffc28);
      local_f8 = (int *)std::vector<int,_std::allocator<int>_>::end(in_stack_fffffffffffffc28);
      __gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>::
      __normal_iterator<int*>
                ((__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> *)
                 CONCAT44(in_stack_fffffffffffffc34,in_stack_fffffffffffffc30),
                 (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                 in_stack_fffffffffffffc28);
      __last_00._M_current._4_4_ = in_stack_fffffffffffffc54;
      __last_00._M_current._0_4_ = in_stack_fffffffffffffc50;
      local_100 = (int *)std::vector<int,_std::allocator<int>_>::erase
                                   ((vector<int,_std::allocator<int>_> *)
                                    CONCAT44(in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48),
                                    in_stack_fffffffffffffc58,__last_00);
    }
  }
  common_batch_clear(local_48);
  local_108 = (ulong)(int)(local_78[2] + local_68);
  while (uVar20 = local_108, sVar9 = std::vector<int,_std::allocator<int>_>::size(local_38),
        uVar20 < sVar9) {
    std::vector<int,_std::allocator<int>_>::operator[](local_38,local_108);
    local_134 = 0;
    local_130 = &local_134;
    local_128 = 1;
    std::allocator<int>::allocator((allocator<int> *)0x367d8e);
    __l._M_array._4_4_ = in_stack_fffffffffffffc6c;
    __l._M_array._0_4_ = in_stack_fffffffffffffc68;
    __l._M_len = in_stack_fffffffffffffc70;
    std::vector<int,_std::allocator<int>_>::vector
              (in_stack_fffffffffffffc60,__l,(allocator_type *)in_stack_fffffffffffffc58._M_current)
    ;
    common_batch_add((llama_batch *)CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50),
                     in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48,
                     (vector<int,_std::allocator<int>_> *)
                     CONCAT44(in_stack_fffffffffffffc44,in_stack_fffffffffffffc40),
                     SUB41((uint)in_stack_fffffffffffffc3c >> 0x18,0));
    std::vector<int,_std::allocator<int>_>::~vector
              ((vector<int,_std::allocator<int>_> *)
               CONCAT44(in_stack_fffffffffffffc44,in_stack_fffffffffffffc40));
    std::allocator<int>::~allocator((allocator<int> *)0x367df7);
    std::vector<int,_std::allocator<int>_>::operator[](local_38,local_108);
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)
               CONCAT44(in_stack_fffffffffffffc44,in_stack_fffffffffffffc40),
               (value_type_conflict *)CONCAT44(in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38))
    ;
    local_108 = local_108 + 1;
  }
  if (0 < local_48->n_tokens) {
    in_stack_fffffffffffffc58._M_current = (int *)local_48->logits;
    local_178 = *(undefined8 *)local_48;
    plStack_170 = local_48->token;
    pfVar1 = local_48->embd;
    plVar2 = local_48->pos;
    piVar3 = local_48->n_seq_id;
    pplVar4 = local_48->seq_id;
    local_168._0_4_ = SUB84(pfVar1,0);
    local_168._4_4_ = (undefined4)((ulong)pfVar1 >> 0x20);
    uStack_160._0_4_ = SUB84(plVar2,0);
    uStack_160._4_4_ = (undefined4)((ulong)plVar2 >> 0x20);
    local_158._0_4_ = (llama_pos)piVar3;
    local_158._4_4_ = (llama_token)((ulong)piVar3 >> 0x20);
    uStack_150._0_4_ = SUB84(pplVar4,0);
    uStack_150._4_4_ = (undefined4)((ulong)pplVar4 >> 0x20);
    in_stack_fffffffffffffc38 = (undefined4)local_168;
    in_stack_fffffffffffffc3c = local_168._4_4_;
    in_stack_fffffffffffffc40 = (undefined4)uStack_160;
    in_stack_fffffffffffffc44 = uStack_160._4_4_;
    in_stack_fffffffffffffc48 = (llama_pos)local_158;
    in_stack_fffffffffffffc4c = local_158._4_4_;
    in_stack_fffffffffffffc50 = (undefined4)uStack_150;
    in_stack_fffffffffffffc54 = uStack_150._4_4_;
    local_168 = pfVar1;
    uStack_160 = plVar2;
    local_158 = piVar3;
    uStack_150 = pplVar4;
    local_148 = (allocator_type *)in_stack_fffffffffffffc58._M_current;
    llama_decode(*local_50);
  }
  sVar9 = std::vector<int,_std::allocator<int>_>::size(local_60);
  local_17c = (uint)sVar9;
  if (0 < common_log_verbosity_thold) {
    pcVar13 = common_log_main();
    common_log_add(pcVar13,GGML_LOG_LEVEL_DEBUG,"%s: n_past = %d\n","common_speculative_gen_draft",
                   (ulong)local_17c);
  }
  common_batch_clear(local_48);
  local_1ac = 0;
  local_1a8 = &local_1ac;
  local_1a0 = 1;
  std::allocator<int>::allocator((allocator<int> *)0x367ff8);
  __l_00._M_array._4_4_ = in_stack_fffffffffffffc6c;
  __l_00._M_array._0_4_ = in_stack_fffffffffffffc68;
  __l_00._M_len = in_stack_fffffffffffffc70;
  std::vector<int,_std::allocator<int>_>::vector
            (in_stack_fffffffffffffc60,__l_00,(allocator_type *)in_stack_fffffffffffffc58._M_current
            );
  common_batch_add((llama_batch *)CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50),
                   in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48,
                   (vector<int,_std::allocator<int>_> *)
                   CONCAT44(in_stack_fffffffffffffc44,in_stack_fffffffffffffc40),
                   SUB41((uint)in_stack_fffffffffffffc3c >> 0x18,0));
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)
             CONCAT44(in_stack_fffffffffffffc44,in_stack_fffffffffffffc40));
  std::allocator<int>::~allocator((allocator<int> *)0x368064);
  std::vector<int,_std::allocator<int>_>::push_back
            ((vector<int,_std::allocator<int>_> *)
             CONCAT44(in_stack_fffffffffffffc44,in_stack_fffffffffffffc40),
             (value_type_conflict *)CONCAT44(in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38));
  __a = (allocator_type *)local_48->logits;
  uVar14 = *(undefined8 *)local_48;
  plVar5 = local_48->token;
  pfVar1 = local_48->embd;
  plVar2 = local_48->pos;
  piVar3 = local_48->n_seq_id;
  pplVar4 = local_48->seq_id;
  uStack_1e0._0_4_ = SUB84(plVar5,0);
  uStack_1e0._4_4_ = (undefined4)((ulong)plVar5 >> 0x20);
  local_1d8._0_4_ = SUB84(pfVar1,0);
  local_1d8._4_4_ = (undefined4)((ulong)pfVar1 >> 0x20);
  uStack_1d0._0_4_ = SUB84(plVar2,0);
  uStack_1d0._4_4_ = (llama_token)((ulong)plVar2 >> 0x20);
  local_1c8._0_4_ = (llama_pos)piVar3;
  local_1c8._4_4_ = (llama_token)((ulong)piVar3 >> 0x20);
  uStack_1c0._0_4_ = SUB84(pplVar4,0);
  uStack_1c0._4_4_ = (undefined4)((ulong)pplVar4 >> 0x20);
  uStack_290 = (undefined4)uStack_1e0;
  uStack_28c = uStack_1e0._4_4_;
  local_288 = (undefined4)local_1d8;
  uStack_284 = local_1d8._4_4_;
  uStack_280 = (undefined4)uStack_1d0;
  lStack_27c = uStack_1d0._4_4_;
  local_278 = (llama_pos)local_1c8;
  lStack_274 = local_1c8._4_4_;
  uStack_270 = (undefined4)uStack_1c0;
  uStack_26c = uStack_1c0._4_4_;
  local_1e8 = uVar14;
  uStack_1e0 = plVar5;
  local_1d8 = pfVar1;
  uStack_1d0 = plVar2;
  local_1c8 = piVar3;
  uStack_1c0 = pplVar4;
  local_1b8 = __a;
  llama_decode(*local_50);
  common_sampler_reset((common_sampler *)0x368106);
  local_1ec = 0;
  while( true ) {
    uVar19 = (undefined1)((uint)in_stack_fffffffffffffc78 >> 0x18);
    if ((int)local_14 <= (int)local_1ec) {
      return in_RDI;
    }
    common_batch_clear(local_48);
    common_sampler_sample
              (in_stack_fffffffffffffc88,
               (llama_context *)CONCAT44(in_stack_fffffffffffffc84,in_stack_fffffffffffffc80),
               in_stack_fffffffffffffc7c,(bool)uVar19);
    local_1f8 = common_sampler_get_candidates((common_sampler *)*local_58);
    local_204[2] = 0;
    while( true ) {
      iVar8 = local_204[2];
      local_204[1] = 3;
      local_204[0] = (int)local_1f8->size;
      piVar10 = std::min<int>(local_204 + 1,local_204);
      if (*piVar10 <= iVar8) break;
      if (0 < common_log_verbosity_thold) {
        pcVar13 = common_log_main();
        in_stack_fffffffffffffc84 = local_1f8->data[local_204[2]].id;
        in_stack_fffffffffffffc88 = (common_sampler *)(double)local_1f8->data[local_204[2]].p;
        in_stack_fffffffffffffc7c = local_204[2];
        in_stack_fffffffffffffc80 = local_1ec;
        common_token_to_piece_abi_cxx11_
                  ((llama_context *)CONCAT44(lStack_274,local_278),lStack_27c,
                   SUB41((uint)uStack_280 >> 0x18,0));
        uVar14 = std::__cxx11::string::c_str();
        common_log_add((int)in_stack_fffffffffffffc88,(ggml_log_level)pcVar13,(char *)0x1,
                       " - draft candidate %3d, pos %3d: %6d (%8.3f) \'%s\'\n",
                       (ulong)in_stack_fffffffffffffc7c,(ulong)in_stack_fffffffffffffc80,
                       (ulong)in_stack_fffffffffffffc84);
        std::__cxx11::string::~string(local_228);
      }
      local_204[2] = local_204[2] + 1;
    }
    local_22c = local_1f8->data->id;
    common_sampler_accept
              ((common_sampler *)CONCAT44(uStack_28c,uStack_290),
               (llama_token)((ulong)uVar14 >> 0x20),SUB81((ulong)uVar14 >> 0x18,0));
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)CONCAT44(lStack_27c,uStack_280),
               (value_type_conflict *)CONCAT44(uStack_284,local_288));
    uVar19 = (undefined1)((uint)uStack_284 >> 0x18);
    in_stack_fffffffffffffc78 = (int)local_14;
    sVar9 = std::vector<int,_std::allocator<int>_>::size(in_RDI);
    if (in_stack_fffffffffffffc78 <= (int)sVar9) break;
    if (local_1f8->data->p < local_c) {
      return in_RDI;
    }
    iVar8 = local_17c + 1 + local_1ec;
    local_25c = 0;
    local_258 = &local_25c;
    local_250 = 1;
    puVar18 = &local_25d;
    this = local_48;
    lVar17 = local_22c;
    std::allocator<int>::allocator((allocator<int> *)0x368441);
    __l_01._M_array._4_4_ = iVar8;
    __l_01._M_array._0_4_ = lVar17;
    __l_01._M_len = (size_type)puVar18;
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)this,__l_01,__a);
    common_batch_add((llama_batch *)CONCAT44(uStack_26c,uStack_270),lStack_274,local_278,
                     (vector<int,_std::allocator<int>_> *)CONCAT44(lStack_27c,uStack_280),
                     (bool)uVar19);
    std::vector<int,_std::allocator<int>_>::~vector
              ((vector<int,_std::allocator<int>_> *)CONCAT44(lStack_27c,uStack_280));
    std::allocator<int>::~allocator((allocator<int> *)0x3684a1);
    __a = (allocator_type *)local_48->logits;
    uVar14 = *(undefined8 *)local_48;
    uStack_290 = SUB84(local_48->token,0);
    uStack_28c = (undefined4)((ulong)local_48->token >> 0x20);
    local_288 = SUB84(local_48->embd,0);
    uStack_284 = (undefined4)((ulong)local_48->embd >> 0x20);
    uStack_280 = SUB84(local_48->pos,0);
    lStack_27c = (llama_token)((ulong)local_48->pos >> 0x20);
    local_278 = (llama_pos)local_48->n_seq_id;
    lStack_274 = (llama_token)((ulong)local_48->n_seq_id >> 0x20);
    uStack_270 = SUB84(local_48->seq_id,0);
    uStack_26c = (undefined4)((ulong)local_48->seq_id >> 0x20);
    llama_decode(*local_50);
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)CONCAT44(lStack_27c,uStack_280),
               (value_type_conflict *)CONCAT44(uStack_284,local_288));
    local_1ec = local_1ec + 1;
  }
  return in_RDI;
}

Assistant:

llama_tokens common_speculative_gen_draft(
        struct common_speculative * spec,
        struct common_speculative_params params,
        const llama_tokens & prompt_tgt,
        llama_token id_last) {
    auto & batch  = spec->batch;
    auto & ctx    = spec->ctx;
    auto & smpl   = spec->smpl;
    auto & prompt = spec->prompt;

    int reuse_i = 0;
    int reuse_n = 0;

    const int n_ctx = llama_n_ctx(ctx) - params.n_draft;

    const int i_start = std::max<int>(0, (int) prompt_tgt.size() - n_ctx);

    // reuse as much as possible from the old draft context
    // ideally, the draft context should be as big as the target context and we will always reuse the entire prompt
    for (int i = 0; i < (int) prompt.size(); ++i) {
        int cur = 0;
        while (i_start + cur < (int) prompt_tgt.size() &&
               i       + cur < (int) prompt.size() &&
               prompt_tgt[i_start + cur] == prompt[i + cur]) {
            cur++;
        }

        if ((cur >= params.n_reuse || n_ctx >= (int) prompt_tgt.size()) && cur > reuse_n) {
            reuse_i = i;
            reuse_n = cur;
        }
    }

    LOG_DBG("%s: reuse_i = %d, reuse_n = %d, prompt = %d\n", __func__, reuse_i, reuse_n, (int) prompt.size());

    llama_tokens result;
    result.reserve(params.n_draft);

    if (reuse_n == 0) {
        llama_kv_self_clear(ctx);

        prompt.clear();
    } else {
        // this happens when a previous draft has been discarded (for example, due to being too small), but the
        // target model agreed with it. in this case, we simply pass back the previous results to save compute
        if (reuse_i + reuse_n < (int) prompt.size() && prompt[reuse_i + reuse_n] == id_last) {
            for (int i = reuse_i + reuse_n + 1; i < (int) prompt.size(); ++i) {
                result.push_back(prompt[i]);

                if (params.n_draft <= (int) result.size()) {
                    break;
                }
            }

            return result;
        }

        if (reuse_i > 0) {
            llama_kv_self_seq_rm (ctx, 0, 0, reuse_i);
            llama_kv_self_seq_add(ctx, 0, reuse_i, -1, -reuse_i);

            prompt.erase(prompt.begin(), prompt.begin() + reuse_i);
        }

        if (reuse_n < (int) prompt.size()) {
            llama_kv_self_seq_rm (ctx, 0, reuse_n, -1);

            prompt.erase(prompt.begin() + reuse_n, prompt.end());
        }
    }

    // prepare a batch to evaluate any new tokens in the prompt
    common_batch_clear(batch);

    for (size_t i = i_start + reuse_n; i < prompt_tgt.size(); ++i) {
        //LOG_DBG("i = %d, i_start = %d, reuse_n = %d, i - i_start = %d, id = %6d\n", i, i_start, reuse_n, i - i_start, prompt_tgt[i]);
        common_batch_add(batch, prompt_tgt[i], i - i_start, { 0 }, false);

        prompt.push_back(prompt_tgt[i]);
    }

    // we should rarely end-up here during normal decoding
    if (batch.n_tokens > 0) {
        //LOG_DBG("%s: draft prompt batch: %s\n", __func__, string_from(ctx, batch).c_str());

        llama_decode(ctx, batch);
    }

    const llama_pos n_past = prompt.size();

    LOG_DBG("%s: n_past = %d\n", __func__, n_past);

    common_batch_clear(batch);
    common_batch_add  (batch, id_last, n_past, { 0 }, true);

    prompt.push_back(id_last);

    //LOG_DBG("%s: draft prompt: %s\n", __func__, string_from(ctx, prompt).c_str());

    llama_decode(ctx, batch);

    common_sampler_reset(smpl);

    // sample n_draft tokens from the draft model
    for (int i = 0; i < params.n_draft; ++i) {
        common_batch_clear(batch);

        common_sampler_sample(smpl, ctx, 0, true);

        const auto * cur_p = common_sampler_get_candidates(smpl);

        for (int k = 0; k < std::min(3, (int) cur_p->size); ++k) {
            LOG_DBG(" - draft candidate %3d, pos %3d: %6d (%8.3f) '%s'\n",
                    k, i, cur_p->data[k].id, cur_p->data[k].p, common_token_to_piece(ctx, cur_p->data[k].id).c_str());
        }

        // add drafted token for each sequence
        const llama_token id = cur_p->data[0].id;

        common_sampler_accept(smpl, id, true);

        result.push_back(id);

        if (params.n_draft <= (int) result.size()) {
            break;
        }

        // only collect very high-confidence draft tokens
        if (cur_p->data[0].p < params.p_min) {
            break;
        }

        common_batch_add(batch, id, n_past + i + 1, { 0 }, true);

        // evaluate the drafted tokens on the draft model
        llama_decode(ctx, batch);

        prompt.push_back(id);
    }

    return result;
}